

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  int iVar1;
  bool bVar2;
  string *local_c18;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  allocator<char> local_b92;
  allocator<char> local_b91;
  string local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  string local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  string local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  int local_a0c;
  string local_a08;
  string local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  allocator<char> local_925;
  int local_924;
  string local_920;
  string local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  int local_7fc;
  string local_7f8;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  int local_6d4;
  string local_6d0;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  int local_5ac;
  string local_5a8;
  int local_584;
  string local_580;
  string local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  int local_45c;
  string local_458;
  int local_434;
  string local_430;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator<char> local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined4 local_188;
  int local_184;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string dimension;
  string local_78 [8];
  string dimensionArray;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string dimensionBase;
  int numUsedBindings_local;
  VkShaderStageFlagBits stage_local;
  ImageDescriptorCase *this_local;
  
  if ((*(int *)((long)this + 0x8c) == 0) || (*(int *)((long)this + 0x8c) == 4)) {
    local_bb8 = "1D";
  }
  else {
    if ((*(int *)((long)this + 0x8c) == 1) || (*(int *)((long)this + 0x8c) == 5)) {
      local_bc0 = "2D";
    }
    else {
      if (*(int *)((long)this + 0x8c) == 2) {
        local_bc8 = "3D";
      }
      else {
        bVar2 = true;
        if (*(int *)((long)this + 0x8c) != 3) {
          bVar2 = *(int *)((long)this + 0x8c) == 6;
        }
        local_bc8 = (char *)0x0;
        if (bVar2) {
          local_bc8 = "Cube";
        }
      }
      local_bc0 = local_bc8;
    }
    local_bb8 = local_bc0;
  }
  dimensionBase.field_2._8_4_ = numUsedBindings;
  dimensionBase.field_2._12_4_ = stage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,local_bb8,&local_41);
  std::allocator<char>::~allocator(&local_41);
  if ((*(int *)((long)this + 0x8c) == 0) || (*(int *)((long)this + 0x8c) == 4)) {
    local_be8 = "1DArray";
  }
  else {
    if ((*(int *)((long)this + 0x8c) == 1) || (*(int *)((long)this + 0x8c) == 5)) {
      local_bf0 = "2DArray";
    }
    else {
      if (*(int *)((long)this + 0x8c) == 2) {
        local_bf8 = "3D";
      }
      else {
        bVar2 = true;
        if (*(int *)((long)this + 0x8c) != 3) {
          bVar2 = *(int *)((long)this + 0x8c) == 6;
        }
        local_bf8 = (char *)0x0;
        if (bVar2) {
          local_bf8 = "CubeArray";
        }
      }
      local_bf0 = local_bf8;
    }
    local_be8 = local_bf0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,local_be8,(allocator<char> *)(dimension.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(dimension.field_2._M_local_buf + 0xf));
  bVar2 = BindingModel::anon_unknown_1::isImageViewTypeArray
                    (*(VkImageViewType *)((long)this + 0x8c));
  if (bVar2) {
    local_c18 = local_78;
  }
  else {
    local_c18 = (string *)local_40;
  }
  std::__cxx11::string::string((string *)local_a0,local_c18);
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 0) {
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      de::toString<int>(&local_160,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_140,"layout(set = 0, binding = ",&local_160);
      std::operator+(&local_120,&local_140,") uniform highp texture");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_e0,&local_100," u_separateTexture;\nlayout(set = 0, binding = ");
      local_184 = dimensionBase.field_2._8_4_ + 1;
      de::toString<int>(&local_180,&local_184);
      std::operator+(&local_c0,&local_e0,&local_180);
      std::operator+(__return_storage_ptr__,&local_c0,") uniform highp sampler u_separateSampler;\n"
                    );
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      break;
    case 1:
      de::toString<int>(&local_208,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_1e8,"layout(set = 0, binding = ",&local_208);
      std::operator+(&local_1c8,&local_1e8,") uniform highp sampler");
      std::operator+(&local_1a8,&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_1a8," u_combinedTextureSampler;\n");
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      break;
    case 2:
      de::toString<int>(&local_288,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_268,"layout(set = 0, binding = ",&local_288);
      std::operator+(&local_248,&local_268,") uniform highp texture");
      std::operator+(&local_228,&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_228," u_separateTexture;\n");
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      break;
    case 3:
      de::toString<int>(&local_308,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_2e8,"layout(set = 0, binding = ",&local_308);
      std::operator+(&local_2c8,&local_2e8,", rgba8) readonly uniform highp image");
      std::operator+(&local_2a8,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_2a8," u_image;\n");
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_309);
      std::allocator<char>::~allocator(&local_309);
    }
  }
  else if (iVar1 - 1U < 2) {
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      if (*(int *)((long)this + 0x88) == 1) {
        de::toString<int>(&local_410,(int *)(dimensionBase.field_2._M_local_buf + 8));
        std::operator+(&local_3f0,"layout(set = 0, binding = ",&local_410);
        std::operator+(&local_3d0,&local_3f0,") uniform highp texture");
        std::operator+(&local_3b0,&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        std::operator+(&local_390,&local_3b0," u_separateTexture;\nlayout(set = 0, binding = ");
        local_434 = dimensionBase.field_2._8_4_ + 1;
        de::toString<int>(&local_430,&local_434);
        std::operator+(&local_370,&local_390,&local_430);
        std::operator+(&local_350,&local_370,
                       ") uniform highp sampler u_separateSamplerA;\nlayout(set = 0, binding = ");
        local_45c = dimensionBase.field_2._8_4_ + 2;
        de::toString<int>(&local_458,&local_45c);
        std::operator+(&local_330,&local_350,&local_458);
        std::operator+(__return_storage_ptr__,&local_330,
                       ") uniform highp sampler u_separateSamplerB;\n");
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
      }
      else {
        de::toString<int>(&local_560,(int *)(dimensionBase.field_2._M_local_buf + 8));
        std::operator+(&local_540,"layout(set = 0, binding = ",&local_560);
        std::operator+(&local_520,&local_540,
                       ") uniform highp sampler u_separateSamplerA;\nlayout(set = 0, binding = ");
        local_584 = dimensionBase.field_2._8_4_ + 1;
        de::toString<int>(&local_580,&local_584);
        std::operator+(&local_500,&local_520,&local_580);
        std::operator+(&local_4e0,&local_500,") uniform highp texture");
        std::operator+(&local_4c0,&local_4e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        std::operator+(&local_4a0,&local_4c0," u_separateTexture;\nlayout(set = 0, binding = ");
        local_5ac = dimensionBase.field_2._8_4_ + 2;
        de::toString<int>(&local_5a8,&local_5ac);
        std::operator+(&local_480,&local_4a0,&local_5a8);
        std::operator+(__return_storage_ptr__,&local_480,
                       ") uniform highp sampler u_separateSamplerB;\n");
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)&local_560);
      }
      break;
    case 1:
      de::toString<int>(&local_6b0,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_690,"layout(set = 0, binding = ",&local_6b0);
      std::operator+(&local_670,&local_690,") uniform highp sampler");
      std::operator+(&local_650,&local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_630,&local_650," u_combinedTextureSamplerA;\nlayout(set = 0, binding = "
                    );
      local_6d4 = dimensionBase.field_2._8_4_ + 1;
      de::toString<int>(&local_6d0,&local_6d4);
      std::operator+(&local_610,&local_630,&local_6d0);
      std::operator+(&local_5f0,&local_610,") uniform highp sampler");
      std::operator+(&local_5d0,&local_5f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_5d0," u_combinedTextureSamplerB;\n");
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      break;
    case 2:
      de::toString<int>(&local_7d8,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_7b8,"layout(set = 0, binding = ",&local_7d8);
      std::operator+(&local_798,&local_7b8,") uniform highp texture");
      std::operator+(&local_778,&local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_758,&local_778," u_separateTextureA;\nlayout(set = 0, binding = ");
      local_7fc = dimensionBase.field_2._8_4_ + 1;
      de::toString<int>(&local_7f8,&local_7fc);
      std::operator+(&local_738,&local_758,&local_7f8);
      std::operator+(&local_718,&local_738,") uniform highp texture");
      std::operator+(&local_6f8,&local_718,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_6f8," u_separateTextureB;\n");
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_7d8);
      break;
    case 3:
      de::toString<int>(&local_900,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_8e0,"layout(set = 0, binding = ",&local_900);
      std::operator+(&local_8c0,&local_8e0,", rgba8) readonly uniform highp image");
      std::operator+(&local_8a0,&local_8c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_880,&local_8a0," u_imageA;\nlayout(set = 0, binding = ");
      local_924 = dimensionBase.field_2._8_4_ + 1;
      de::toString<int>(&local_920,&local_924);
      std::operator+(&local_860,&local_880,&local_920);
      std::operator+(&local_840,&local_860,", rgba8) readonly uniform highp image");
      std::operator+(&local_820,&local_840,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_820," u_imageB;\n");
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_925);
      std::allocator<char>::~allocator(&local_925);
    }
  }
  else if (iVar1 == 3) {
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      de::toString<int>(&local_9e8,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_9c8,"layout(set = 0, binding = ",&local_9e8);
      std::operator+(&local_9a8,&local_9c8,") uniform highp texture");
      std::operator+(&local_988,&local_9a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_968,&local_988," u_separateTexture;\nlayout(set = 0, binding = ");
      local_a0c = dimensionBase.field_2._8_4_ + 1;
      de::toString<int>(&local_a08,&local_a0c);
      std::operator+(&local_948,&local_968,&local_a08);
      std::operator+(__return_storage_ptr__,&local_948,
                     ") uniform highp sampler u_separateSampler[2];\n");
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_a08);
      std::__cxx11::string::~string((string *)&local_968);
      std::__cxx11::string::~string((string *)&local_988);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::__cxx11::string::~string((string *)&local_9c8);
      std::__cxx11::string::~string((string *)&local_9e8);
      break;
    case 1:
      de::toString<int>(&local_a90,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_a70,"layout(set = 0, binding = ",&local_a90);
      std::operator+(&local_a50,&local_a70,") uniform highp sampler");
      std::operator+(&local_a30,&local_a50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_a30," u_combinedTextureSampler[2];\n");
      std::__cxx11::string::~string((string *)&local_a30);
      std::__cxx11::string::~string((string *)&local_a50);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a90);
      break;
    case 2:
      de::toString<int>(&local_b10,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_af0,"layout(set = 0, binding = ",&local_b10);
      std::operator+(&local_ad0,&local_af0,") uniform highp texture");
      std::operator+(&local_ab0,&local_ad0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_ab0," u_separateTexture[2];\n");
      std::__cxx11::string::~string((string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::__cxx11::string::~string((string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_b10);
      break;
    case 3:
      de::toString<int>(&local_b90,(int *)(dimensionBase.field_2._M_local_buf + 8));
      std::operator+(&local_b70,"layout(set = 0, binding = ",&local_b90);
      std::operator+(&local_b50,&local_b70,", rgba8) readonly uniform highp image");
      std::operator+(&local_b30,&local_b50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(__return_storage_ptr__,&local_b30," u_image[2];\n");
      std::__cxx11::string::~string((string *)&local_b30);
      std::__cxx11::string::~string((string *)&local_b50);
      std::__cxx11::string::~string((string *)&local_b70);
      std::__cxx11::string::~string((string *)&local_b90);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_b91);
      std::allocator<char>::~allocator(&local_b91);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_b92);
    std::allocator<char>::~allocator(&local_b92);
  }
  local_188 = 1;
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	// Vulkan-style resources are arrays implicitly, OpenGL-style are not
	const std::string	dimensionBase	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("Cube")
										: (DE_NULL);
	const std::string	dimensionArray	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("CubeArray")
										: (DE_NULL);
	const std::string	dimension		= isImageViewTypeArray(m_viewType) ? dimensionArray : dimensionBase;

	if (m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS)
		DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
		{
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}
		}

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					if (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
					else
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTextureA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimensionBase + " u_separateTextureB;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_imageA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ", rgba8) readonly uniform highp image" + dimension + " u_imageB;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image[2];\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		default:
			DE_FATAL("Impossible");
			return "";
	}
}